

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O0

void * os_banner_create(void *parent,int where,void *other,int wintype,int align,int siz,
                       int siz_units,unsigned_long style)

{
  size_t sVar1;
  int in_ECX;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  ulong in_stack_00000010;
  osgen_win_t *win;
  undefined8 in_stack_ffffffffffffffb0;
  uint buf_size;
  void *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  int where_00;
  osgen_txtwin_t *local_8;
  
  if (os_f_plain == 0) {
    buf_size = (uint)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
    where_00 = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
    if (in_ECX == 1) {
      local_8 = osgen_create_txtwin(where_00,(void *)CONCAT44(1,in_stack_ffffffffffffffc0),
                                    in_stack_ffffffffffffffb8,buf_size,
                                    (uint)in_stack_ffffffffffffffb0);
    }
    else {
      if (in_ECX != 2) {
        return (void *)0x0;
      }
      local_8 = (osgen_txtwin_t *)
                osgen_create_gridwin
                          (where_00,(void *)CONCAT44(2,in_stack_ffffffffffffffc0),
                           in_stack_ffffffffffffffb8,buf_size,(uint)in_stack_ffffffffffffffb0);
    }
    if (local_8 == (osgen_txtwin_t *)0x0) {
      local_8 = (osgen_txtwin_t *)0x0;
    }
    else {
      (local_8->base).alignment = in_R8D;
      if ((in_R8D == 2) || (in_R8D == 3)) {
        (local_8->base).wid = 0;
        if (S_main_win == (osgen_txtwin_t *)0x0) {
          sVar1 = (size_t)G_oss_screen_height;
        }
        else {
          sVar1 = (S_main_win->base).ht;
        }
        (local_8->base).ht = sVar1;
      }
      else {
        if (S_main_win == (osgen_txtwin_t *)0x0) {
          sVar1 = (size_t)G_oss_screen_width;
        }
        else {
          sVar1 = (S_main_win->base).wid;
        }
        (local_8->base).wid = sVar1;
        (local_8->base).ht = 0;
      }
      if ((in_stack_00000010 & 8) != 0) {
        (local_8->base).flags = (local_8->base).flags | 1;
      }
      if ((in_stack_00000010 & 0x40) != 0) {
        (local_8->base).flags = (local_8->base).flags | 9;
      }
      if ((in_stack_00000010 & 0x100) != 0) {
        (local_8->base).flags = (local_8->base).flags | 0x10;
      }
      if ((in_stack_00000010 & 0x80) != 0) {
        (local_8->base).flags = (local_8->base).flags | 0x20;
      }
      (local_8->base).size = in_R9D;
      (local_8->base).size_type = in_stack_00000008;
      if (in_R9D != 0) {
        osgen_recalc_layout();
      }
    }
  }
  else {
    local_8 = (osgen_txtwin_t *)0x0;
  }
  return local_8;
}

Assistant:

void *os_banner_create(void *parent, int where, void *other, int wintype,
                       int align, int siz, int siz_units, unsigned long style)
{
    osgen_win_t *win;

    /* we don't support banners in plain mode */
    if (os_f_plain)
        return 0;

    /* if the parent is null, it means that it's a child of the main window */
    if (parent == 0)
        parent = &S_main_win->base;

    /* check for a supported window type */
    switch(wintype)
    {
    case OS_BANNER_TYPE_TEXT:
        /* 
         *   Create a text window.  We don't support scrollback in the UI in
         *   banner windows, so we only need enough for what's on the screen
         *   for redrawing.  Overallocate by a bit, though, to be safe in
         *   case the screen grows later.  
         */
        win = (osgen_win_t *)osgen_create_txtwin(where, other, parent,
            G_oss_screen_height * G_oss_screen_width * 2,
            G_oss_screen_height * 2);
        break;

    case OS_BANNER_TYPE_TEXTGRID:
        /*
         *   Create a text grid window.  Make it ten lines high at the
         *   current screen width; we'll automatically expand this
         *   allocation as needed later, so this size doesn't have to be a
         *   perfect guess; but the closer we get the better, as it's more
         *   efficient to avoid reallocating if possible.  
         */
        win = (osgen_win_t *)osgen_create_gridwin(where, other, parent,
            G_oss_screen_width, 10);
        break;

    default:
        /* unsupported type - return failure */
        return 0;
    }
    
    /* if that failed, return null */
    if (win == 0)
        return 0;

    /* set the alignment */
    win->alignment = align;

    /*
     *   Start out width a zero size in the settable dimension, and the
     *   current main text area size in the constrained dimension. 
     */
    if (align == OS_BANNER_ALIGN_LEFT || align == OS_BANNER_ALIGN_RIGHT)
    {
        /* the width is the settable dimension for a left/right banner */
        win->wid = 0;
        win->ht = (S_main_win != 0
                   ? S_main_win->base.ht : G_oss_screen_height);
    }
    else
    {
        /* the height is the settable dimension for a top/bottom banner */
        win->wid = (S_main_win != 0
                    ? S_main_win->base.wid : G_oss_screen_width);
        win->ht = 0;
    }

    /* set auto-vscroll mode if they want it */
    if ((style & OS_BANNER_STYLE_AUTO_VSCROLL) != 0)
        win->flags |= OSGEN_AUTO_VSCROLL;

    /* 
     *   Note the MORE mode style, if specified.  MORE mode implies
     *   auto-vscroll, so add that style as well if MORE mode is requested.  
     */
    if ((style & OS_BANNER_STYLE_MOREMODE) != 0)
        win->flags |= OSGEN_AUTO_VSCROLL | OSGEN_MOREMODE;

    /* note the "strut" style flags, if specified */
    if ((style & OS_BANNER_STYLE_VSTRUT) != 0)
        win->flags |= OSGEN_VSTRUT;
    if ((style & OS_BANNER_STYLE_HSTRUT) != 0)
        win->flags |= OSGEN_HSTRUT;

    /* remember the requested size */
    win->size = siz;
    win->size_type = siz_units;

    /* 
     *   if the window has a non-zero size, recalculate the layout; if the
     *   size is zero, we don't have to bother, since the layout won't affect
     *   anything on the display 
     */
    if (siz != 0)
        osgen_recalc_layout();

    /* return the window */
    return win;
}